

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward.hpp
# Opt level: O2

void __thiscall
backward::Printer::print_snippet
          (Printer *this,ostream *os,char *indent,SourceLoc *source_loc,Colorize *colorize,
          type color_code,int context_size)

{
  ostream *poVar1;
  pointer ppVar2;
  char *pcVar3;
  lines_t lines;
  
  SnippetFactory::get_snippet
            (&lines,&this->_snippets,&source_loc->filename,source_loc->line,context_size);
  for (ppVar2 = lines.
                super__Vector_base<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      ppVar2 != lines.
                super__Vector_base<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; ppVar2 = ppVar2 + 1) {
    if (ppVar2->first == source_loc->line) {
      Colorize::set_color(colorize,color_code);
      poVar1 = std::operator<<(os,indent);
      pcVar3 = ">";
    }
    else {
      poVar1 = std::operator<<(os,indent);
      pcVar3 = " ";
    }
    std::operator<<(poVar1,pcVar3);
    *(undefined8 *)(os + *(long *)(*(long *)os + -0x18) + 0x10) = 4;
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)os);
    poVar1 = std::operator<<(poVar1,": ");
    poVar1 = std::operator<<(poVar1,(string *)&ppVar2->second);
    std::operator<<(poVar1,"\n");
    if (ppVar2->first == source_loc->line) {
      Colorize::set_color(colorize,reset);
    }
  }
  std::
  vector<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&lines);
  return;
}

Assistant:

void print_snippet(std::ostream &os, const char *indent,
                     const ResolvedTrace::SourceLoc &source_loc,
                     Colorize &colorize, Color::type color_code,
                     int context_size) {
    using namespace std;
    typedef SnippetFactory::lines_t lines_t;

    lines_t lines = _snippets.get_snippet(source_loc.filename, source_loc.line,
                                          static_cast<unsigned>(context_size));

    for (lines_t::const_iterator it = lines.begin(); it != lines.end(); ++it) {
      if (it->first == source_loc.line) {
        colorize.set_color(color_code);
        os << indent << ">";
      } else {
        os << indent << " ";
      }
      os << std::setw(4) << it->first << ": " << it->second << "\n";
      if (it->first == source_loc.line) {
        colorize.set_color(Color::reset);
      }
    }
  }